

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcPart.c
# Opt level: O2

void Abc_NtkPartitionPrint(Abc_Ntk_t *pNtk,Vec_Ptr_t *vPartsAll,Vec_Ptr_t *vPartSuppsAll)

{
  uint uVar1;
  void *pvVar2;
  void *pvVar3;
  uint uVar4;
  uint i;
  
  i = 0;
  uVar4 = 0;
  do {
    if (vPartSuppsAll->nSize <= (int)i) break;
    pvVar2 = Vec_PtrEntry(vPartSuppsAll,i);
    pvVar3 = Vec_PtrEntry(vPartsAll,i);
    uVar1 = *(uint *)((long)pvVar3 + 4);
    printf("%d=(%d,%d) ",(ulong)i,(ulong)*(uint *)((long)pvVar2 + 4),(ulong)uVar1);
    uVar4 = uVar4 + uVar1;
    i = i + 1;
  } while (i != vPartsAll->nSize);
  printf("\nTotal = %d. Outputs = %d.\n",(ulong)uVar4,(ulong)(uint)pNtk->vCos->nSize);
  return;
}

Assistant:

void Abc_NtkPartitionPrint( Abc_Ntk_t * pNtk, Vec_Ptr_t * vPartsAll, Vec_Ptr_t * vPartSuppsAll )
{
    Vec_Int_t * vOne;
    int i, nOutputs, Counter;

    Counter = 0;
    Vec_PtrForEachEntry( Vec_Int_t *, vPartSuppsAll, vOne, i )
    {
        nOutputs = Vec_IntSize((Vec_Int_t *)Vec_PtrEntry(vPartsAll, i));
        printf( "%d=(%d,%d) ", i, Vec_IntSize(vOne), nOutputs );
        Counter += nOutputs;
        if ( i == Vec_PtrSize(vPartsAll) - 1 )
            break;
    }
//    assert( Counter == Abc_NtkCoNum(pNtk) );
    printf( "\nTotal = %d. Outputs = %d.\n", Counter, Abc_NtkCoNum(pNtk) );
}